

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnWidth(int column_n,float width)

{
  float fVar1;
  ImGuiTable *pIVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiTableColumn *pIVar4;
  int in_EDI;
  float in_XMM0_Da;
  float fVar5;
  float column_1_width;
  ImGuiTableColumn *column_1;
  float max_width;
  float min_width;
  float column_0_width;
  ImGuiTableColumn *column_0;
  ImGuiTable *table;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffa8;
  int i;
  ImGuiTable *in_stack_ffffffffffffffb0;
  ImGuiTableColumn *this;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 uVar6;
  undefined1 uVar7;
  ImGuiTableColumn *local_38;
  
  pIVar2 = GImGui->CurrentTable;
  uVar7 = false;
  if (pIVar2 != (ImGuiTable *)0x0) {
    uVar7 = (pIVar2->IsLayoutLocked & 1U) == 0;
  }
  if ((bool)uVar7 == false) {
    __assert_fail("table != __null && table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x7cb,"void ImGui::TableSetColumnWidth(int, float)");
  }
  uVar6 = false;
  if (-1 < in_EDI) {
    uVar6 = in_EDI < pIVar2->ColumnsCount;
  }
  if ((bool)uVar6 == false) {
    __assert_fail("column_n >= 0 && column_n < table->ColumnsCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x7cc,"void ImGui::TableSetColumnWidth(int, float)");
  }
  i = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                     ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffffb0,i);
  if (pIVar2->MinColumnWidth <= 0.0) {
    __assert_fail("table->MinColumnWidth > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x7d2,"void ImGui::TableSetColumnWidth(int, float)");
  }
  fVar1 = pIVar2->MinColumnWidth;
  fVar5 = TableGetMaxColumnWidth(in_stack_ffffffffffffffb0,i);
  fVar5 = ImMax<float>(fVar1,fVar5);
  fVar5 = ImClamp<float>(in_XMM0_Da,fVar1,fVar5);
  if (((pIVar3->WidthGiven != fVar5) || (NAN(pIVar3->WidthGiven) || NAN(fVar5))) &&
     ((pIVar3->WidthRequest != fVar5 || (NAN(pIVar3->WidthRequest) || NAN(fVar5))))) {
    if (pIVar3->NextEnabledColumn == -1) {
      local_38 = (ImGuiTableColumn *)0x0;
    }
    else {
      local_38 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffffb0,i);
    }
    this = local_38;
    if (((pIVar3->Flags & 8U) == 0) ||
       (((local_38 != (ImGuiTableColumn *)0x0 && (pIVar2->LeftMostStretchedColumn != -1)) &&
        (pIVar4 = ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)local_38,i),
        pIVar4->DisplayOrder < pIVar3->DisplayOrder)))) {
      if (local_38 == (ImGuiTableColumn *)0x0) {
        if (pIVar3->PrevEnabledColumn == -1) {
          local_38 = (ImGuiTableColumn *)0x0;
        }
        else {
          local_38 = ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)this,i);
        }
      }
      if (local_38 != (ImGuiTableColumn *)0x0) {
        fVar5 = ImMax<float>(local_38->WidthRequest - (fVar5 - pIVar3->WidthRequest),fVar1);
        fVar1 = (pIVar3->WidthRequest + local_38->WidthRequest) - fVar5;
        if (fVar1 <= 0.0 || fVar5 <= 0.0) {
          __assert_fail("column_0_width > 0.0f && column_1_width > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                        ,0x810,"void ImGui::TableSetColumnWidth(int, float)");
        }
        pIVar3->WidthRequest = fVar1;
        local_38->WidthRequest = fVar5;
        if (((pIVar3->Flags | local_38->Flags) & 4U) != 0) {
          TableUpdateColumnsWeightFromWidth
                    ((ImGuiTable *)
                     CONCAT44(fVar5,CONCAT13(uVar7,CONCAT12(uVar6,in_stack_ffffffffffffffc0))));
        }
        pIVar2->IsSettingsDirty = true;
      }
    }
    else {
      pIVar3->WidthRequest = fVar5;
      pIVar2->IsSettingsDirty = true;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidth(int column_n, float width)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && table->IsLayoutLocked == false);
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column_0 = &table->Columns[column_n];
    float column_0_width = width;

    // Apply constraints early
    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    IM_ASSERT(table->MinColumnWidth > 0.0f);
    const float min_width = table->MinColumnWidth;
    const float max_width = ImMax(min_width, TableGetMaxColumnWidth(table, column_n));
    column_0_width = ImClamp(column_0_width, min_width, max_width);
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthGiven, column_0_width);
    ImGuiTableColumn* column_1 = (column_0->NextEnabledColumn != -1) ? &table->Columns[column_0->NextEnabledColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and multiple Stretch columns.
    // - All fixed: easy.
    // - All stretch: easy.
    // - One or more fixed + one stretch: easy.
    // - One or more fixed + more than one stretch: tricky.
    // Qt when manual resize is enabled only support a single _trailing_ stretch column.

    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> ok
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> ok
    // - F1 W2 F3  resize from W2|          --> ok
    // - F1 W3 F2  resize from W3|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move.
    // - W1 F2 F3  resize from F2|          --> ok
    // All resizes from a Wx columns are locking other columns.

    // Possible improvements:
    // - W1 W2 W3  resize W1|               --> to not be stuck, both W2 and W3 would stretch down. Seems possible to fix. Would be most beneficial to simplify resize of all-weighted columns.
    // - W3 F1 F2  resize W3|               --> to not be stuck past F1|, both F1 and F2 would need to stretch down, which would be lossy or ambiguous. Seems hard to fix.

    // [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().

    // If we have all Fixed columns OR resizing a Fixed column that doesn't come after a Stretch one, we can do an offsetting resize.
    // This is the preferred resize path
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
        if (!column_1 || table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder >= column_0->DisplayOrder)
        {
            column_0->WidthRequest = column_0_width;
            table->IsSettingsDirty = true;
            return;
        }

    // We can also use previous column if there's no next one (this is used when doing an auto-fit on the right-most stretch column)
    if (column_1 == NULL)
        column_1 = (column_0->PrevEnabledColumn != -1) ? &table->Columns[column_0->PrevEnabledColumn] : NULL;
    if (column_1 == NULL)
        return;

    // Resizing from right-side of a Stretch column before a Fixed column forward sizing to left-side of fixed column.
    // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
    float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
    column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
    IM_ASSERT(column_0_width > 0.0f && column_1_width > 0.0f);
    column_0->WidthRequest = column_0_width;
    column_1->WidthRequest = column_1_width;
    if ((column_0->Flags | column_1->Flags) & ImGuiTableColumnFlags_WidthStretch)
        TableUpdateColumnsWeightFromWidth(table);
    table->IsSettingsDirty = true;
}